

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O3

address __thiscall
pstore::index::details::internal_node::flush
          (internal_node *this,transaction_base *transaction,uint shifts)

{
  ulong uVar1;
  uint uVar2;
  address aVar3;
  long lVar4;
  
  uVar2 = size(this);
  if (uVar2 != 0) {
    lVar4 = 0;
    do {
      uVar1 = *(ulong *)((long)this->children_ + lVar4);
      if ((uVar1 & 2) != 0) {
        if (shifts + 6 < 0x42) {
          if ((uVar1 & 1) == 0) {
            assert_failed("p.is_internal ()",
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                          ,0x162);
          }
          aVar3 = flush((internal_node *)(uVar1 & 0xfffffffffffffffc),transaction,shifts + 6);
          *(value_type *)((long)this->children_ + lVar4) = aVar3.a_;
        }
        else {
          if ((uVar1 & 1) == 0) {
            assert_failed("p.is_linear ()",
                          "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/hamt_map_types.cpp"
                          ,0x169);
          }
          aVar3 = linear_node::flush((linear_node *)(uVar1 & 0xfffffffffffffffc),transaction);
          *(value_type *)((long)this->children_ + lVar4) = aVar3.a_ | 1;
          operator_delete((linear_node *)(uVar1 & 0xfffffffffffffffc));
        }
      }
      lVar4 = lVar4 + 8;
    } while ((ulong)uVar2 << 3 != lVar4);
  }
  aVar3 = store_node(this,transaction);
  return (address)(aVar3.a_ | 1);
}

Assistant:

address internal_node::flush (transaction_base & transaction, unsigned shifts) {
                shifts += hash_index_bits;
                for (auto & p : *this) {
                    // If it is a heap node, flush its children first (depth-first search).
                    if (p.is_heap ()) {
                        if (shifts < max_hash_bits) { // internal node
                            PSTORE_ASSERT (p.is_internal ());
                            auto * const internal = p.untag<internal_node *> ();
                            p = internal->flush (transaction, shifts);
                            // This node is owned by a container in the outer HAMT structure. Don't
                            // delete it here. If this ever changes, then add a 'delete internal;'
                            // here.
                        } else { // linear node
                            PSTORE_ASSERT (p.is_linear ());
                            auto * const linear = p.untag<linear_node *> ();
                            p = linear->flush (transaction) | internal_node_bit;
                            delete linear;
                        }
                    }
                }
                // Flush itself.
                return this->store_node (transaction) | internal_node_bit;
            }